

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UBool utf8TextAccess(UText *ut,int64_t index,UBool forward)

{
  uint8_t uVar1;
  void *pvVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  long lVar14;
  int *piVar15;
  uint uVar16;
  uint8_t *s;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  int32_t srcIx;
  int local_8c;
  ulong local_88;
  int *local_80;
  undefined8 local_78;
  UText *local_70;
  UChar *local_68;
  uint8_t *local_60;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  int *local_40;
  int *local_38;
  
  s = (uint8_t *)ut->context;
  uVar5 = ut->b;
  uVar11 = 0x7fffffff;
  if (index < 0x7fffffff) {
    uVar11 = index;
  }
  uVar12 = 0;
  if (0 < (long)uVar11) {
    uVar12 = uVar11;
  }
  uVar4 = (uint)uVar12;
  if ((int)uVar5 < (int)uVar4) {
    if ((int)uVar5 < 0) {
      if (ut->c <= (int)uVar4) {
        uVar17 = ut->c;
        uVar20 = uVar17;
        if ((int)uVar17 < (int)uVar4) {
          puVar13 = s + (int)uVar17;
          do {
            uVar20 = uVar17;
            if (*puVar13 == '\0') break;
            uVar17 = uVar17 + 1;
            ut->c = uVar17;
            puVar13 = puVar13 + 1;
            uVar20 = uVar4;
          } while (uVar4 != uVar17);
        }
        if (s[(int)uVar20] == '\0') {
          ut->b = uVar20;
          *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
          uVar12 = (ulong)uVar20;
          uVar5 = uVar20;
        }
      }
    }
    else {
      uVar12 = (ulong)uVar5;
    }
  }
  uVar4 = (uint)uVar12;
  lVar9 = (long)(int)uVar4;
  local_70 = ut;
  local_60 = s;
  if (forward == '\0') {
    if (ut->chunkNativeStart == lVar9) {
      if (uVar4 == 0) goto LAB_002f5f4c;
      if (((int)uVar4 <= *ut->q) || (*(int *)((long)ut->q + 4) < (int)uVar4)) goto LAB_002f59e6;
    }
    else {
LAB_002f59e6:
      iVar8 = *ut->q;
      if (((int)uVar4 <= iVar8) || (*(int *)((long)ut->q + 4) < (int)uVar4)) {
        if (uVar4 != 0) {
          if ((ut->chunkNativeStart < lVar9) && (lVar9 <= ut->chunkNativeLimit)) {
            pvVar2 = ut->p;
            iVar8 = (uint)*(byte *)((long)pvVar2 + (lVar9 - *(int *)((long)pvVar2 + 0x14)) + 0x84) -
                    *(int *)((long)pvVar2 + 8);
            ut->chunkOffset = iVar8;
            return iVar8 != 0;
          }
          if ((uVar4 != ut->b) && ((char)s[lVar9] < -0x40)) {
            uVar5 = utf8_back1SafeBody_63(s,0,uVar4);
            uVar12 = (ulong)uVar5;
          }
          piVar15 = (int *)ut->q;
          ut->q = ut->p;
          ut->p = piVar15;
          local_80 = piVar15 + 6;
          local_8c = (int)uVar12;
          iVar8 = local_8c + -0x65;
          *(undefined1 *)((long)piVar15 + 0x82) = 0x65;
          *(undefined1 *)((long)piVar15 + 0xe9) = 0x22;
          lVar9 = (long)iVar8;
          uVar4 = 0x22;
          local_78 = CONCAT44(local_78._4_4_,iVar8);
          uVar5 = 0x22;
          local_88 = uVar12;
          do {
            uVar17 = uVar5;
            if (((long)local_8c < 1) || (local_8c - iVar8 < 6)) break;
            uVar11 = (long)local_8c - 1;
            local_8c = (int)uVar11;
            uVar17 = uVar5 - 1;
            bVar10 = s[uVar11 & 0xffffffff];
            uVar12 = (ulong)uVar17;
            if ((char)bVar10 < '\0') {
              uVar4 = utf8_prevCharSafeBody_63(s,0,&local_8c,(uint)bVar10,-3);
              if ((int)uVar4 < 0x10000) {
                *(ushort *)((long)local_80 + uVar12 * 2) = (ushort)uVar4;
              }
              else {
                *(ushort *)((long)piVar15 + uVar12 * 2 + 0x18) = (ushort)uVar4 & 0x3ff | 0xdc00;
                *(char *)((long)piVar15 + uVar12 + 0x60) = (char)local_8c - (char)local_78;
                uVar17 = uVar5 - 2;
                uVar12 = (ulong)uVar17;
                *(short *)((long)piVar15 + uVar12 * 2 + 0x18) = (short)(uVar4 >> 10) + -0x2840;
              }
              *(char *)((long)piVar15 + uVar12 + 0x60) = (char)local_8c - (char)local_78;
              do {
                *(char *)((long)piVar15 + uVar11 + (0x84 - lVar9)) = (char)uVar17;
                bVar21 = (long)local_8c < (long)uVar11;
                uVar11 = uVar11 - 1;
                s = local_60;
                iVar8 = (int)local_78;
                uVar4 = uVar17;
              } while (bVar21);
            }
            else {
              *(short *)((long)piVar15 + uVar12 * 2 + 0x18) = (short)(char)bVar10;
              *(char *)((long)piVar15 + (long)(local_8c - iVar8) + 0x84) = (char)uVar17;
              *(char *)((long)piVar15 + uVar12 + 0x60) = (char)uVar11 - (char)iVar8;
            }
            uVar5 = uVar17;
          } while (2 < (int)uVar17);
          *piVar15 = local_8c;
          piVar15[1] = (int)local_88;
          piVar15[2] = uVar17;
          piVar15[3] = 0x22;
          piVar15[4] = uVar4 - uVar17;
          piVar15[5] = iVar8;
          local_70->chunkContents = (UChar *)((long)local_80 + (long)(int)uVar17 * 2);
          local_70->chunkLength = 0x22 - uVar17;
          local_70->chunkOffset = 0x22 - uVar17;
          local_70->chunkNativeStart = (long)local_8c;
          local_70->chunkNativeLimit = (long)(int)local_88;
          local_70->nativeIndexingLimit = uVar4 - uVar17;
          return '\x01';
        }
        if (iVar8 != 0) {
LAB_002f5edc:
          puVar3 = (uint *)ut->q;
          *puVar3 = uVar4;
          puVar3[1] = uVar4;
          puVar3[2] = 0;
          puVar3[3] = 0;
          puVar3[4] = 0;
          puVar3[5] = uVar4;
          *(undefined1 *)(puVar3 + 0x18) = 0;
          *(undefined1 *)(puVar3 + 0x21) = 0;
        }
LAB_002f5f05:
        piVar15 = (int *)ut->q;
        ut->q = ut->p;
        ut->p = piVar15;
        iVar8 = piVar15[2];
        ut->chunkContents = (UChar *)((long)piVar15 + (long)iVar8 * 2 + 0x18);
        iVar8 = piVar15[3] - iVar8;
        ut->chunkLength = iVar8;
        ut->chunkNativeStart = (long)*piVar15;
        uVar5 = piVar15[1];
        ut->chunkNativeLimit = (long)(int)uVar5;
        ut->nativeIndexingLimit = piVar15[4];
        if (uVar4 != uVar5) {
LAB_002f5f4c:
          ut->chunkOffset = 0;
          return '\0';
        }
        goto LAB_002f5f47;
      }
    }
LAB_002f5b94:
    piVar15 = (int *)ut->q;
    ut->q = ut->p;
    ut->p = piVar15;
    iVar8 = piVar15[2];
    ut->chunkContents = (UChar *)((long)piVar15 + (long)iVar8 * 2 + 0x18);
    ut->chunkLength = piVar15[3] - iVar8;
    ut->chunkNativeStart = (long)*piVar15;
    ut->chunkNativeLimit = (long)piVar15[1];
    ut->nativeIndexingLimit = piVar15[4];
    iVar8 = (uint)*(byte *)((long)piVar15 + (lVar9 - piVar15[5]) + 0x84) - iVar8;
LAB_002f5c05:
    ut->chunkOffset = iVar8;
    return '\x01';
  }
  lVar14 = ut->chunkNativeLimit;
  if (lVar14 == lVar9) {
    if (uVar4 != uVar5) {
      if ((*ut->q <= (int)uVar4) && ((int)uVar4 < *(int *)((long)ut->q + 4))) goto LAB_002f5b94;
      goto LAB_002f5994;
    }
  }
  else {
LAB_002f5994:
    piVar15 = (int *)ut->q;
    if ((*piVar15 <= (int)uVar4) && ((int)uVar4 < piVar15[1])) goto LAB_002f5b94;
    if (uVar4 != uVar5) {
      if ((lVar14 <= lVar9) || (lVar9 < ut->chunkNativeStart)) {
        if ((char)s[lVar9] < -0x40) {
          uVar5 = utf8_back1SafeBody_63(s,0,uVar4);
          uVar12 = (ulong)uVar5;
        }
        piVar15 = (int *)ut->q;
        ut->q = ut->p;
        ut->p = piVar15;
        uVar5 = ut->b;
        uVar4 = 0x7fffffff;
        if (uVar5 < 0x7fffffff) {
          uVar4 = uVar5;
        }
        local_68 = (UChar *)(piVar15 + 6);
        local_40 = piVar15 + 0x18;
        local_50 = (long)(int)uVar12;
        local_48 = (long)piVar15 + (0x84 - local_50);
        uVar17 = 0;
        uVar11 = uVar12 & 0xffffffff;
        local_78 = 0;
        local_88 = uVar12;
        local_58 = uVar4;
        local_54 = uVar5;
        local_38 = piVar15;
        do {
          uVar18 = (uint)uVar11;
          lVar9 = (long)(int)uVar18;
          uVar1 = s[lVar9];
          uVar20 = (uint)(char)uVar1;
          if ((char)uVar1 < '\x01') {
            if ((char)local_78 == '\0') {
              piVar15[4] = uVar17;
              local_78 = CONCAT71((int7)((ulong)local_78 >> 8),1);
            }
            uVar16 = uVar18 + 1;
            bVar10 = s[lVar9];
            uVar7 = (uint)bVar10;
            if ((char)bVar10 < '\0') {
              uVar20 = 0xfffd;
              if (uVar16 != uVar4) {
                if (bVar10 < 0xe0) {
                  if (0xc1 < bVar10) {
                    uVar7 = uVar7 & 0x1f;
                    uVar11 = (ulong)uVar16;
LAB_002f5e52:
                    if ((byte)(s[(int)uVar11] ^ 0x80) < 0x40) {
                      uVar20 = uVar7 << 6 | s[(int)uVar11] ^ 0x80;
                      uVar11 = (ulong)((int)uVar11 + 1);
                    }
                    goto LAB_002f5d04;
                  }
                }
                else if (bVar10 < 0xf0) {
                  uVar7 = uVar7 & 0xf;
                  if (((byte)" 000000000000\x1000"[uVar7] >> (s[(int)uVar16] >> 5) & 1) != 0) {
                    bVar10 = s[(int)uVar16] & 0x3f;
                    uVar11 = (ulong)uVar16;
LAB_002f5e2c:
                    uVar19 = (int)uVar11 + 1;
                    uVar11 = (ulong)uVar19;
                    if (uVar19 == uVar4) goto LAB_002f5d04;
                    uVar7 = (uint)bVar10 | uVar7 << 6;
                    goto LAB_002f5e52;
                  }
                }
                else if (bVar10 < 0xf5) {
                  if (((uint)(int)""[s[(int)uVar16] >> 4] >> (uVar7 - 0xf0 & 0x1f) & 1) != 0) {
                    uVar11 = lVar9 + 2;
                    if (((uint)uVar11 == uVar4) || (bVar10 = s[uVar11] + 0x80, 0x3f < bVar10))
                    goto LAB_002f5d04;
                    uVar7 = s[(int)uVar16] & 0x3f | (uVar7 - 0xf0) * 0x40;
                    goto LAB_002f5e2c;
                  }
                }
              }
              uVar11 = (ulong)uVar16;
            }
            else {
              uVar11 = (ulong)uVar16;
              uVar20 = uVar7;
            }
LAB_002f5d04:
            bVar21 = (int)uVar5 < 0;
            iVar8 = (int)uVar11;
            if (uVar20 == 0 && bVar21) {
              uVar11 = (ulong)(iVar8 - 1);
            }
            else {
              lVar14 = (long)(int)uVar17;
              local_80 = (int *)CONCAT44(local_80._4_4_,uVar16);
              if (uVar20 < 0x10000) {
                uVar7 = uVar17 + 1;
                local_68[lVar14] = (UChar)uVar20;
              }
              else {
                local_68[lVar14] = (short)(uVar20 >> 10) + L'ퟀ';
                uVar7 = uVar17 + 2;
                local_68[lVar14 + 1] = (UChar)uVar20 & 0x3ffU | 0xdc00;
              }
              uVar5 = uVar17 + 1;
              if ((int)(uVar17 + 1) < (int)uVar7) {
                uVar5 = uVar7;
              }
              memset((void *)(lVar14 + (long)local_40),uVar18 - (int)local_88,
                     (ulong)(~uVar17 + uVar5) + 1);
              iVar6 = (int)local_80;
              if ((int)local_80 < iVar8) {
                iVar6 = iVar8;
              }
              memset((void *)(lVar9 + local_48),uVar17,(ulong)(~uVar18 + iVar6) + 1);
              piVar15 = local_38;
              s = local_60;
              uVar5 = local_54;
              uVar4 = local_58;
              uVar17 = uVar7;
            }
            iVar8 = (int)uVar11;
            uVar12 = local_88;
            if (uVar20 == 0 && bVar21) {
              local_78 = 1;
              iVar6 = (int)local_88;
LAB_002f5fe9:
              *(char *)((long)piVar15 + (long)(int)uVar17 + 0x60) = (char)(iVar8 - iVar6);
              *(char *)((long)piVar15 + (long)(iVar8 - iVar6) + 0x84) = (char)uVar17;
              *piVar15 = iVar6;
              piVar15[1] = iVar8;
              piVar15[2] = 0;
              piVar15[3] = uVar17;
              if ((char)local_78 == '\0') {
                piVar15[4] = uVar17;
              }
              piVar15[5] = iVar6;
              local_70->chunkContents = local_68;
              local_70->chunkOffset = 0;
              local_70->chunkLength = uVar17;
              local_70->chunkNativeStart = local_50;
              local_70->chunkNativeLimit = (long)iVar8;
              local_70->nativeIndexingLimit = piVar15[4];
              if (-1 < (int)uVar5) {
                return '\x01';
              }
              if (iVar8 <= local_70->c) {
                return '\x01';
              }
              local_70->c = iVar8;
              if (uVar20 == 0) {
                local_70->b = iVar8;
                *(byte *)&local_70->providerProperties = (byte)local_70->providerProperties & 0xfd;
                return '\x01';
              }
              return '\x01';
            }
          }
          else {
            *(short *)((long)piVar15 + (long)(int)uVar17 * 2 + 0x18) = (short)(char)uVar1;
            iVar8 = uVar18 - (int)uVar12;
            *(char *)((long)piVar15 + (long)(int)uVar17 + 0x60) = (char)iVar8;
            *(char *)((long)piVar15 + (long)iVar8 + 0x84) = (char)uVar17;
            uVar11 = (ulong)(uVar18 + 1);
            uVar17 = uVar17 + 1;
          }
          iVar6 = (int)uVar12;
          iVar8 = (int)uVar11;
          if (((int)uVar4 <= iVar8) || (0x1f < (int)uVar17)) goto LAB_002f5fe9;
        } while( true );
      }
      pvVar2 = ut->p;
      iVar8 = (uint)*(byte *)((long)pvVar2 + (lVar9 - *(int *)((long)pvVar2 + 0x14)) + 0x84) -
              *(int *)((long)pvVar2 + 8);
      goto LAB_002f5c05;
    }
    if (lVar14 != lVar9) {
      if (uVar4 != piVar15[1]) goto LAB_002f5edc;
      goto LAB_002f5f05;
    }
  }
  iVar8 = ut->chunkLength;
LAB_002f5f47:
  ut->chunkOffset = iVar8;
  return '\0';
}

Assistant:

static UBool U_CALLCONV
utf8TextAccess(UText *ut, int64_t index, UBool forward) {
    //
    //  Apologies to those who are allergic to goto statements.
    //    Consider each goto to a labelled block to be the equivalent of
    //         call the named block as if it were a function();
    //         return;
    //
    const uint8_t *s8=(const uint8_t *)ut->context;
    UTF8Buf *u8b = NULL;
    int32_t  length = ut->b;         // Length of original utf-8
    int32_t  ix= (int32_t)index;     // Requested index, trimmed to 32 bits.
    int32_t  mapIndex = 0;
    if (index<0) {
        ix=0;
    } else if (index > 0x7fffffff) {
        // Strings with 64 bit lengths not supported by this UTF-8 provider.
        ix = 0x7fffffff;
    }

    // Pin requested index to the string length.
    if (ix>length) {
        if (length>=0) {
            ix=length;
        } else if (ix>=ut->c) {
            // Zero terminated string, and requested index is beyond
            //   the region that has already been scanned.
            //   Scan up to either the end of the string or to the
            //   requested position, whichever comes first.
            while (ut->c<ix && s8[ut->c]!=0) {
                ut->c++;
            }
            //  TODO:  support for null terminated string length > 32 bits.
            if (s8[ut->c] == 0) {
                // We just found the actual length of the string.
                //  Trim the requested index back to that.
                ix     = ut->c;
                ut->b  = ut->c;
                length = ut->c;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
    }

    //
    // Dispatch to the appropriate action for a forward iteration request.
    //
    if (forward) {
        if (ix==ut->chunkNativeLimit) {
            // Check for normal sequential iteration cases first.
            if (ix==length) {
                // Just reached end of string
                // Don't swap buffers, but do set the
                //   current buffer position.
                ut->chunkOffset = ut->chunkLength;
                return FALSE;
            } else {
                // End of current buffer.
                //   check whether other buffer already has what we need.
                UTF8Buf *altB = (UTF8Buf *)ut->q;
                if (ix>=altB->bufNativeStart && ix<altB->bufNativeLimit) {
                    goto swapBuffers;
                }
            }
        }

        // A random access.  Desired index could be in either or niether buf.
        // For optimizing the order of testing, first check for the index
        //    being in the other buffer.  This will be the case for uses that
        //    move back and forth over a fairly limited range
        {
            u8b = (UTF8Buf *)ut->q;   // the alternate buffer
            if (ix>=u8b->bufNativeStart && ix<u8b->bufNativeLimit) {
                // Requested index is in the other buffer.
                goto swapBuffers;
            }
            if (ix == length) {
                // Requested index is end-of-string.
                //   (this is the case of randomly seeking to the end.
                //    The case of iterating off the end is handled earlier.)
                if (ix == ut->chunkNativeLimit) {
                    // Current buffer extends up to the end of the string.
                    //   Leave it as the current buffer.
                    ut->chunkOffset = ut->chunkLength;
                    return FALSE;
                }
                if (ix == u8b->bufNativeLimit) {
                    // Alternate buffer extends to the end of string.
                    //   Swap it in as the current buffer.
                    goto swapBuffersAndFail;
                }

                // Neither existing buffer extends to the end of the string.
                goto makeStubBuffer;
            }

            if (ix<ut->chunkNativeStart || ix>=ut->chunkNativeLimit) {
                // Requested index is in neither buffer.
                goto fillForward;
            }

            // Requested index is in this buffer.
            u8b = (UTF8Buf *)ut->p;   // the current buffer
            mapIndex = ix - u8b->toUCharsMapStart;
            U_ASSERT(mapIndex < (int32_t)sizeof(UTF8Buf::mapToUChars));
            ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
            return TRUE;

        }
    }


    //
    // Dispatch to the appropriate action for a
    //   Backwards Diretion iteration request.
    //
    if (ix==ut->chunkNativeStart) {
        // Check for normal sequential iteration cases first.
        if (ix==0) {
            // Just reached the start of string
            // Don't swap buffers, but do set the
            //   current buffer position.
            ut->chunkOffset = 0;
            return FALSE;
        } else {
            // Start of current buffer.
            //   check whether other buffer already has what we need.
            UTF8Buf *altB = (UTF8Buf *)ut->q;
            if (ix>altB->bufNativeStart && ix<=altB->bufNativeLimit) {
                goto swapBuffers;
            }
        }
    }

    // A random access.  Desired index could be in either or niether buf.
    // For optimizing the order of testing,
    //    Most likely case:  in the other buffer.
    //    Second most likely: in neither buffer.
    //    Unlikely, but must work:  in the current buffer.
    u8b = (UTF8Buf *)ut->q;   // the alternate buffer
    if (ix>u8b->bufNativeStart && ix<=u8b->bufNativeLimit) {
        // Requested index is in the other buffer.
        goto swapBuffers;
    }
    // Requested index is start-of-string.
    //   (this is the case of randomly seeking to the start.
    //    The case of iterating off the start is handled earlier.)
    if (ix==0) {
        if (u8b->bufNativeStart==0) {
            // Alternate buffer contains the data for the start string.
            // Make it be the current buffer.
            goto swapBuffersAndFail;
        } else {
            // Request for data before the start of string,
            //   neither buffer is usable.
            //   set up a zero-length buffer.
            goto makeStubBuffer;
        }
    }

    if (ix<=ut->chunkNativeStart || ix>ut->chunkNativeLimit) {
        // Requested index is in neither buffer.
        goto fillReverse;
    }

    // Requested index is in this buffer.
    //   Set the utf16 buffer index.
    u8b = (UTF8Buf *)ut->p;
    mapIndex = ix - u8b->toUCharsMapStart;
    ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
    if (ut->chunkOffset==0) {
        // This occurs when the first character in the text is
        //   a multi-byte UTF-8 char, and the requested index is to
        //   one of the trailing bytes.  Because there is no preceding ,
        //   character, this access fails.  We can't pick up on the
        //   situation sooner because the requested index is not zero.
        return FALSE;
    } else {
        return TRUE;
    }



swapBuffers:
    //  The alternate buffer (ut->q) has the string data that was requested.
    //  Swap the primary and alternate buffers, and set the
    //   chunk index into the new primary buffer.
    {
        u8b   = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b;
        ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
        ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
        ut->chunkNativeStart    = u8b->bufNativeStart;
        ut->chunkNativeLimit    = u8b->bufNativeLimit;
        ut->nativeIndexingLimit = u8b->bufNILimit;

        // Index into the (now current) chunk
        // Use the map to set the chunk index.  It's more trouble than it's worth
        //    to check whether native indexing can be used.
        U_ASSERT(ix>=u8b->bufNativeStart);
        U_ASSERT(ix<=u8b->bufNativeLimit);
        mapIndex = ix - u8b->toUCharsMapStart;
        U_ASSERT(mapIndex>=0);
        U_ASSERT(mapIndex<(int32_t)sizeof(u8b->mapToUChars));
        ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;

        return TRUE;
    }


 swapBuffersAndFail:
    // We got a request for either the start or end of the string,
    //  with iteration continuing in the out-of-bounds direction.
    // The alternate buffer already contains the data up to the
    //  start/end.
    // Swap the buffers, then return failure, indicating that we couldn't
    //  make things correct for continuing the iteration in the requested
    //  direction.  The position & buffer are correct should the
    //  user decide to iterate in the opposite direction.
    u8b   = (UTF8Buf *)ut->q;
    ut->q = ut->p;
    ut->p = u8b;
    ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
    ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
    ut->chunkNativeStart    = u8b->bufNativeStart;
    ut->chunkNativeLimit    = u8b->bufNativeLimit;
    ut->nativeIndexingLimit = u8b->bufNILimit;

    // Index into the (now current) chunk
    //  For this function  (swapBuffersAndFail), the requested index
    //    will always be at either the start or end of the chunk.
    if (ix==u8b->bufNativeLimit) {
        ut->chunkOffset = ut->chunkLength;
    } else  {
        ut->chunkOffset = 0;
        U_ASSERT(ix == u8b->bufNativeStart);
    }
    return FALSE;

makeStubBuffer:
    //   The user has done a seek/access past the start or end
    //   of the string.  Rather than loading data that is likely
    //   to never be used, just set up a zero-length buffer at
    //   the position.
    u8b = (UTF8Buf *)ut->q;
    u8b->bufNativeStart   = ix;
    u8b->bufNativeLimit   = ix;
    u8b->bufStartIdx      = 0;
    u8b->bufLimitIdx      = 0;
    u8b->bufNILimit       = 0;
    u8b->toUCharsMapStart = ix;
    u8b->mapToNative[0]   = 0;
    u8b->mapToUChars[0]   = 0;
    goto swapBuffersAndFail;



fillForward:
    {
        // Move the incoming index to a code point boundary.
        U8_SET_CP_START(s8, 0, ix);

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        int32_t strLen = ut->b;
        UBool   nulTerminated = FALSE;
        if (strLen < 0) {
            strLen = 0x7fffffff;
            nulTerminated = TRUE;
        }

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative  = u8b_swap->mapToNative;
        uint8_t *mapToUChars  = u8b_swap->mapToUChars;
        int32_t  destIx       = 0;
        int32_t  srcIx        = ix;
        UBool    seenNonAscii = FALSE;
        UChar32  c = 0;

        // Fill the chunk buffer and mapping arrays.
        while (destIx<UTF8_TEXT_CHUNK_SIZE) {
            c = s8[srcIx];
            if (c>0 && c<0x80) {
                // Special case ASCII range for speed.
                //   zero is excluded to simplify bounds checking.
                buf[destIx] = (UChar)c;
                mapToNative[destIx]    = (uint8_t)(srcIx - ix);
                mapToUChars[srcIx-ix]  = (uint8_t)destIx;
                srcIx++;
                destIx++;
            } else {
                // General case, handle everything.
                if (seenNonAscii == FALSE) {
                    seenNonAscii = TRUE;
                    u8b_swap->bufNILimit = destIx;
                }

                int32_t  cIx      = srcIx;
                int32_t  dIx      = destIx;
                int32_t  dIxSaved = destIx;
                U8_NEXT_OR_FFFD(s8, srcIx, strLen, c);
                if (c==0 && nulTerminated) {
                    srcIx--;
                    break;
                }

                U16_APPEND_UNSAFE(buf, destIx, c);
                do {
                    mapToNative[dIx++] = (uint8_t)(cIx - ix);
                } while (dIx < destIx);

                do {
                    mapToUChars[cIx++ - ix] = (uint8_t)dIxSaved;
                } while (cIx < srcIx);
            }
            if (srcIx>=strLen) {
                break;
            }

        }

        //  store Native <--> Chunk Map entries for the end of the buffer.
        //    There is no actual character here, but the index position is valid.
        mapToNative[destIx]     = (uint8_t)(srcIx - ix);
        mapToUChars[srcIx - ix] = (uint8_t)destIx;

        //  fill in Buffer descriptor
        u8b_swap->bufNativeStart     = ix;
        u8b_swap->bufNativeLimit     = srcIx;
        u8b_swap->bufStartIdx        = 0;
        u8b_swap->bufLimitIdx        = destIx;
        if (seenNonAscii == FALSE) {
            u8b_swap->bufNILimit     = destIx;
        }
        u8b_swap->toUCharsMapStart   = u8b_swap->bufNativeStart;

        // Set UText chunk to refer to this buffer.
        ut->chunkContents       = buf;
        ut->chunkOffset         = 0;
        ut->chunkLength         = u8b_swap->bufLimitIdx;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;

        // For zero terminated strings, keep track of the maximum point
        //   scanned so far.
        if (nulTerminated && srcIx>ut->c) {
            ut->c = srcIx;
            if (c==0) {
                // We scanned to the end.
                //   Remember the actual length.
                ut->b = srcIx;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
        return TRUE;
    }


fillReverse:
    {
        // Move the incoming index to a code point boundary.
        // Can only do this if the incoming index is somewhere in the interior of the string.
        //   If index is at the end, there is no character there to look at.
        if (ix != ut->b) {
            // Note: this function will only move the index back if it is on a trail byte
            //       and there is a preceding lead byte and the sequence from the lead 
            //       through this trail could be part of a valid UTF-8 sequence
            //       Otherwise the index remains unchanged.
            U8_SET_CP_START(s8, 0, ix);
        }

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative = u8b_swap->mapToNative;
        uint8_t *mapToUChars = u8b_swap->mapToUChars;
        int32_t  toUCharsMapStart = ix - sizeof(UTF8Buf::mapToUChars) + 1;
        // Note that toUCharsMapStart can be negative. Happens when the remaining
        // text from current position to the beginning is less than the buffer size.
        // + 1 because mapToUChars must have a slot at the end for the bufNativeLimit entry.
        int32_t  destIx = UTF8_TEXT_CHUNK_SIZE+2;   // Start in the overflow region
                                                    //   at end of buffer to leave room
                                                    //   for a surrogate pair at the
                                                    //   buffer start.
        int32_t  srcIx  = ix;
        int32_t  bufNILimit = destIx;
        UChar32   c;

        // Map to/from Native Indexes, fill in for the position at the end of
        //   the buffer.
        //
        mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
        mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;

        // Fill the chunk buffer
        // Work backwards, filling from the end of the buffer towards the front.
        //
        while (destIx>2 && (srcIx - toUCharsMapStart > 5) && (srcIx > 0)) {
            srcIx--;
            destIx--;

            // Get last byte of the UTF-8 character
            c = s8[srcIx];
            if (c<0x80) {
                // Special case ASCII range for speed.
                buf[destIx] = (UChar)c;
                U_ASSERT(toUCharsMapStart <= srcIx);
                mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;
                mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
            } else {
                // General case, handle everything non-ASCII.

                int32_t  sIx      = srcIx;  // ix of last byte of multi-byte u8 char

                // Get the full character from the UTF8 string.
                //   use code derived from tbe macros in utf8.h
                //   Leaves srcIx pointing at the first byte of the UTF-8 char.
                //
                c=utf8_prevCharSafeBody(s8, 0, &srcIx, c, -3);
                // leaves srcIx at first byte of the multi-byte char.

                // Store the character in UTF-16 buffer.
                if (c<0x10000) {
                    buf[destIx] = (UChar)c;
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                } else {
                    buf[destIx]         = U16_TRAIL(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                    buf[--destIx]       = U16_LEAD(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                }

                // Fill in the map from native indexes to UChars buf index.
                do {
                    mapToUChars[sIx-- - toUCharsMapStart] = (uint8_t)destIx;
                } while (sIx >= srcIx);
                U_ASSERT(toUCharsMapStart <= (srcIx+1));

                // Set native indexing limit to be the current position.
                //   We are processing a non-ascii, non-native-indexing char now;
                //     the limit will be here if the rest of the chars to be
                //     added to this buffer are ascii.
                bufNILimit = destIx;
            }
        }
        u8b_swap->bufNativeStart     = srcIx;
        u8b_swap->bufNativeLimit     = ix;
        u8b_swap->bufStartIdx        = destIx;
        u8b_swap->bufLimitIdx        = UTF8_TEXT_CHUNK_SIZE+2;
        u8b_swap->bufNILimit         = bufNILimit - u8b_swap->bufStartIdx;
        u8b_swap->toUCharsMapStart   = toUCharsMapStart;

        ut->chunkContents       = &buf[u8b_swap->bufStartIdx];
        ut->chunkLength         = u8b_swap->bufLimitIdx - u8b_swap->bufStartIdx;
        ut->chunkOffset         = ut->chunkLength;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;
        return TRUE;
    }

}